

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O0

void __thiscall
Rml::GeometryBackgroundBorder::DrawBorderCorner
          (GeometryBackgroundBorder *this,Corner corner,Vector2f pos_outer,Vector2f pos_inner,
          Vector2f pos_circle_center,float R,Vector2f r,ColourbPremultiplied color0,
          ColourbPremultiplied color1)

{
  int iVar1;
  float a0_00;
  float a1_00;
  float a1;
  float a0;
  float R_local;
  Corner corner_local;
  GeometryBackgroundBorder *this_local;
  ColourbPremultiplied color1_local;
  ColourbPremultiplied color0_local;
  Vector2f r_local;
  Vector2f pos_circle_center_local;
  Vector2f pos_inner_local;
  Vector2f pos_outer_local;
  
  a0_00 = (float)(int)(corner + BOTTOM_RIGHT) * 0.5 * 3.1415927;
  a1_00 = (float)(int)(corner + BOTTOM_LEFT) * 0.5 * 3.1415927;
  if ((R != 0.0) || (NAN(R))) {
    color1_local = (ColourbPremultiplied)r.x;
    if (((float)color1_local <= 0.0) ||
       (color0_local = (ColourbPremultiplied)r.y, (float)color0_local <= 0.0)) {
      iVar1 = GetNumPoints(this,R);
      DrawArcPoint(this,pos_circle_center,pos_inner,R,a0_00,a1_00,color0,color1,iVar1);
    }
    else {
      iVar1 = GetNumPoints(this,R);
      DrawArcArc(this,pos_circle_center,R,r,a0_00,a1_00,color0,color1,iVar1);
    }
  }
  else {
    DrawPointPoint(this,pos_outer,pos_inner,color0,color1);
  }
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawBorderCorner(Corner corner, Vector2f pos_outer, Vector2f pos_inner, Vector2f pos_circle_center, float R,
	Vector2f r, ColourbPremultiplied color0, ColourbPremultiplied color1)
{
	const float a0 = float((int)corner + 2) * 0.5f * Math::RMLUI_PI;
	const float a1 = float((int)corner + 3) * 0.5f * Math::RMLUI_PI;

	if (R == 0)
	{
		DrawPointPoint(pos_outer, pos_inner, color0, color1);
	}
	else if (r.x > 0 && r.y > 0)
	{
		DrawArcArc(pos_circle_center, R, r, a0, a1, color0, color1, GetNumPoints(R));
	}
	else
	{
		DrawArcPoint(pos_circle_center, pos_inner, R, a0, a1, color0, color1, GetNumPoints(R));
	}
}